

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-cpu-aarch64.cpp
# Opt level: O3

int ggml::cpu::aarch64::repack<block_q4_0,8l,8l>(ggml_tensor *t,void *data,size_t data_size)

{
  undefined1 auVar1 [16];
  undefined8 uVar2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  int iVar6;
  long lVar7;
  undefined8 uVar8;
  uint uVar9;
  ulong uVar10;
  undefined8 *puVar11;
  long lVar12;
  undefined8 *puVar13;
  undefined1 (*pauVar14) [64];
  long lVar15;
  undefined1 (*pauVar16) [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  block_q4_0 dst_tmp [8];
  block_q4_0x8 out;
  undefined1 local_148 [16];
  ushort auStack_138 [10];
  ushort local_124;
  ushort local_112;
  ushort local_100;
  ushort local_ee;
  ushort local_dc;
  ushort local_ca;
  undefined1 local_b8 [16];
  undefined1 auStack_a8 [48];
  undefined1 local_78 [16];
  undefined1 auStack_68 [48];
  undefined1 auStack_38 [16];
  
  if (t->type == GGML_TYPE_Q4_0) {
    pauVar14 = (undefined1 (*) [64])t->data;
    iVar3 = ggml_nrows();
    lVar7 = t->ne[0];
    lVar12 = lVar7 + 0x1f;
    if (-1 < lVar7) {
      lVar12 = lVar7;
    }
    iVar6 = (int)(lVar12 >> 5);
    if ((long)(iVar3 * iVar6) * 0x12 == data_size) {
      iVar4 = -1;
      if ((((uint)lVar7 | (uint)t->ne[1]) & 7) == 0) {
        if (0 < iVar3) {
          auVar17 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
          auVar18 = vpbroadcastq_avx512f(ZEXT816(7));
          auVar19 = vpbroadcastq_avx512f(ZEXT816(8));
          auVar20 = vpbroadcastq_avx512f(ZEXT816(0x12));
          auVar21 = vpbroadcastq_avx512f(ZEXT816(0x8888888888888888));
          lVar7 = (long)iVar6;
          auVar22 = vpbroadcastq_avx512f();
          uVar10 = 0;
          do {
            if (0 < lVar7) {
              lVar12 = 0;
              puVar11 = (undefined8 *)data;
              pauVar16 = pauVar14;
              do {
                lVar15 = 0;
                puVar13 = puVar11;
                do {
                  *(undefined2 *)((long)auStack_138 + lVar15) = *(undefined2 *)(puVar13 + 2);
                  uVar8 = *puVar13;
                  uVar2 = puVar13[1];
                  puVar13 = (undefined8 *)((long)puVar13 + lVar7 * 0x12);
                  *(undefined8 *)(local_148 + lVar15) = uVar8;
                  *(undefined8 *)(local_148 + lVar15 + 8) = uVar2;
                  lVar15 = lVar15 + 0x12;
                } while (lVar15 != 0x90);
                lVar15 = 2;
                auVar1 = vpinsrw_avx(local_148,(uint)auStack_138[1],1);
                auVar1 = vpinsrw_avx(auVar1,(uint)local_124,2);
                auVar1 = vpinsrw_avx(auVar1,(uint)local_112,3);
                auVar1 = vpinsrw_avx(auVar1,(uint)local_100,4);
                auVar1 = vpinsrw_avx(auVar1,(uint)local_ee,5);
                auVar1 = vpinsrw_avx(auVar1,(uint)local_dc,6);
                auVar1 = vpinsrw_avx(auVar1,(uint)local_ca,7);
                auVar23 = vmovdqa64_avx512f(auVar17);
                do {
                  auVar24 = vpandq_avx512f(auVar23,auVar18);
                  auVar25 = vpandq_avx512f(auVar23,auVar19);
                  auVar23 = vpaddq_avx512f(auVar23,auVar19);
                  auVar24 = vpmuldq_avx512f(auVar24,auVar20);
                  auVar25 = vpaddq_avx512f(auVar22,auVar25);
                  vpaddq_avx512f(auVar25,auVar24);
                  auVar24 = vpgatherqq_avx512f(*(undefined8 *)(uVar10 + 2));
                  auVar24 = vpxorq_avx512f(auVar24,auVar21);
                  auVar24 = vmovdqu64_avx512f(auVar24);
                  *(undefined1 (*) [64])(local_b8 + lVar15 * 8) = auVar24;
                  lVar15 = lVar15 + 8;
                } while (lVar15 != 0x12);
                auVar23._16_48_ = auStack_a8;
                auVar23._0_16_ = auVar1;
                auVar26 = vmovdqu64_avx512f(auVar23);
                auVar24._16_48_ = auStack_68;
                auVar24._0_16_ = local_78;
                auVar24 = vmovdqu64_avx512f(auVar24);
                auVar25._48_16_ = auStack_38;
                auVar25._0_48_ = auStack_68;
                auVar23 = vmovdqu64_avx512f(auVar25);
                pauVar14 = (undefined1 (*) [64])(pauVar16[2] + 0x10);
                lVar12 = lVar12 + 1;
                puVar11 = (undefined8 *)((long)puVar11 + 0x12);
                auVar23 = vmovdqu64_avx512f(auVar23);
                *(undefined1 (*) [64])(pauVar16[1] + 0x10) = auVar23;
                auVar23 = vmovdqu64_avx512f(auVar24);
                pauVar16[1] = auVar23;
                auVar23 = vmovdqu64_avx512f(auVar26);
                *pauVar16 = auVar23;
                pauVar16 = pauVar14;
              } while (lVar12 != lVar7);
            }
            uVar9 = (int)uVar10 + 8;
            uVar10 = (ulong)uVar9;
            data = (void *)((long)data + (long)(iVar6 * 8) * 0x12);
          } while ((int)uVar9 < iVar3);
        }
        iVar4 = 0;
      }
      return iVar4;
    }
    pcVar5 = "data_size == nrow * nblocks * sizeof(block_q4_0)";
    uVar8 = 0x16eb;
  }
  else {
    pcVar5 = "t->type == GGML_TYPE_Q4_0";
    uVar8 = 0x16e1;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml-cpu/ggml-cpu-aarch64.cpp"
             ,uVar8,"GGML_ASSERT(%s) failed",pcVar5);
}

Assistant:

static int repack_q4_0_to_q4_0_8_bl(struct ggml_tensor * t, int interleave_block, const void * GGML_RESTRICT data, size_t data_size) {
    GGML_ASSERT(t->type == GGML_TYPE_Q4_0);
    GGML_ASSERT(interleave_block == 8);
    constexpr int nrows_interleaved = 8;

    block_q4_0x8 * dst = (block_q4_0x8*)t->data;
    const block_q4_0 * src = (const block_q4_0*) data;
    block_q4_0 dst_tmp[8];
    int nrow = ggml_nrows(t);
    int nblocks = t->ne[0] / QK4_0;

    GGML_ASSERT(data_size == nrow * nblocks * sizeof(block_q4_0));

    if (t->ne[1] % nrows_interleaved != 0 || t->ne[0] % 8 != 0) {
        return -1;
    }

    for (int b = 0; b < nrow; b += nrows_interleaved) {
        for (int64_t x = 0; x < nblocks; x++) {
            for (int i  = 0; i < nrows_interleaved; i++ ) {
                dst_tmp[i] = src[x + i * nblocks];
            }
            *dst++ = make_block_q4_0x8(dst_tmp, interleave_block);
        }
        src += nrows_interleaved * nblocks;
    }
    return 0;

    GGML_UNUSED(data_size);
}